

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O3

int gz_fetch(gz_statep state)

{
  int iVar1;
  
  do {
    iVar1 = state->how;
    if (iVar1 == 0) {
      iVar1 = gz_look(state);
      if (iVar1 == -1) {
        return -1;
      }
      if (state->how == 0) {
        return 0;
      }
    }
    else if (iVar1 == 2) {
      (state->strm).avail_out = state->size * 2;
      (state->strm).next_out = state->out;
      iVar1 = gz_decomp(state);
      if (iVar1 == -1) {
        return -1;
      }
    }
    else if (iVar1 == 1) {
      iVar1 = gz_load(state,state->out,state->size * 2,(uint *)state);
      if (iVar1 == -1) {
        return -1;
      }
      (state->x).next = state->out;
      return 0;
    }
    if ((state->x).have != 0) {
      return 0;
    }
  } while ((state->eof == 0) || ((state->strm).avail_in != 0));
  return 0;
}

Assistant:

local int gz_fetch(gz_statep state) {
    z_streamp strm = &(state->strm);

    do {
        switch(state->how) {
        case LOOK:      /* -> LOOK, COPY (only if never GZIP), or GZIP */
            if (gz_look(state) == -1)
                return -1;
            if (state->how == LOOK)
                return 0;
            break;
        case COPY:      /* -> COPY */
            if (gz_load(state, state->out, state->size << 1, &(state->x.have))
                    == -1)
                return -1;
            state->x.next = state->out;
            return 0;
        case GZIP:      /* -> GZIP or LOOK (if end of gzip stream) */
            strm->avail_out = state->size << 1;
            strm->next_out = state->out;
            if (gz_decomp(state) == -1)
                return -1;
        }
    } while (state->x.have == 0 && (!state->eof || strm->avail_in));
    return 0;
}